

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

int kwssys::SystemTools::Stat(char *path,Stat_t *buf)

{
  int *piVar1;
  char *in_RDI;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  allocator local_39;
  string local_38 [52];
  int local_4;
  
  if (in_RDI == (char *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0xe;
    local_4 = -1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,in_RDI,&local_39);
    local_4 = Stat((string *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   (Stat_t *)0x1c932c);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return local_4;
}

Assistant:

int SystemTools::Stat(const char* path, SystemTools::Stat_t* buf)
{
  if (!path) {
    errno = EFAULT;
    return -1;
  }
  return SystemTools::Stat(std::string(path), buf);
}